

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-attack.c
# Opt level: O2

wchar_t borg_launch_bolt_aux_hack(wchar_t i,wchar_t dam,wchar_t typ,wchar_t ammo_location)

{
  monster_race *r_ptr;
  bitflag *pbVar1;
  ushort uVar2;
  ushort uVar3;
  short sVar4;
  short sVar5;
  monster_blow *pmVar6;
  undefined8 *puVar7;
  loc_conflict grid1;
  loc_conflict grid1_00;
  loc_conflict grid1_01;
  monster_race *pmVar8;
  borg_kill *pbVar9;
  borg_kill *pbVar10;
  borg_item_conflict *pbVar11;
  int *piVar12;
  _Bool _Var13;
  _Bool _Var14;
  bool bVar15;
  wchar_t wVar16;
  wchar_t wVar17;
  wchar_t wVar18;
  wchar_t wVar19;
  wchar_t wVar20;
  void *pvVar21;
  int iVar22;
  bool bVar23;
  int16_t iVar24;
  uint uVar25;
  long lVar26;
  char *pcVar27;
  int iVar28;
  borg_grid *ag;
  long lVar29;
  bitflag *flags;
  _Bool *p_Var30;
  borg_item *obj;
  ulong uVar31;
  wchar_t local_48;
  
  pbVar9 = borg_kills;
  pmVar8 = r_info;
  uVar2 = borg_kills[(uint)i].r_idx;
  if ((ulong)uVar2 == 0) {
    return L'\0';
  }
  if ((int)(z_info->r_max - 1) <= (int)(uint)uVar2) {
    return L'\0';
  }
  if ((int)borg_kills[(uint)i].when < borg_t + -2) {
    return L'\0';
  }
  local_48 = borg_kills[(uint)i].pos.x;
  wVar20 = borg_kills[(uint)i].pos.y;
  ag = borg_grids[wVar20] + local_48;
  _Var13 = borg_cave_floor_grid(ag);
  if (!_Var13) {
    return L'\0';
  }
  _Var13 = flag_has_dbg(pmVar8[uVar2].flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL");
  if ((_Var13) &&
     (((4 < ag->feat || ((0x1aU >> (ag->feat & 0x1f) & 1) == 0)) && (ag->trap != true)))) {
    return L'\0';
  }
  _Var13 = flag_has_dbg(pmVar8[uVar2].flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL");
  pbVar10 = borg_kills;
  pmVar8 = r_info;
  if (_Var13) {
    wVar19 = pbVar9[(uint)i].pos.x;
    wVar16 = pbVar9[(uint)i].pos.y;
    iVar22 = 0;
    iVar28 = 0;
    uVar31 = (long)wVar16;
    wVar20 = wVar19 + L'\xffffffff';
    local_48 = wVar19;
    for (lVar26 = -1; wVar17 = wVar20, wVar20 = (wchar_t)uVar31, lVar29 = -1, lVar26 != 2;
        lVar26 = lVar26 + 1) {
      for (; lVar29 != 2; lVar29 = lVar29 + 1) {
        iVar22 = iVar22 + (uint)((byte)(borg_grids[wVar16 + lVar29][lVar26 + wVar19].feat - 0x11) <
                                6);
        iVar28 = iVar28 + (uint)(borg_grids[wVar16 + lVar29][lVar26 + wVar19].feat == '\0');
        uVar31 = (ulong)(uint)((int)lVar29 + wVar16);
      }
      wVar20 = wVar17 + L'\x01';
      local_48 = wVar17;
    }
    if ((1 < iVar22) && (0 < iVar28)) {
      return L'\0';
    }
  }
  uVar2 = borg_kills[(uint)i].r_idx;
  if ((int)(z_info->r_max - 1) <= (int)(uint)uVar2) {
    return L'\0';
  }
  r_ptr = r_info + uVar2;
  grid1.y = borg.c.y;
  grid1.x = borg.c.x;
  wVar16 = distance(grid1,(loc_conflict)borg_kills[(uint)i].pos);
  piVar12 = borg.trait;
  pbVar11 = borg_items;
  iVar22 = borg.trait[0x3d];
  iVar28 = borg.trait[0x86];
  uVar3 = z_info->pack_size;
  sVar4 = borg_items[(ulong)uVar3 + 1].to_h;
  sVar5 = borg_items[ammo_location].to_h;
  wVar19 = pmVar8[uVar2].ac;
  pmVar6 = pmVar8[uVar2].blow;
  bVar23 = false;
  for (lVar26 = 0x10; lVar26 != 0xd0; lVar26 = lVar26 + 0x30) {
    puVar7 = *(undefined8 **)((long)&pmVar6->next + lVar26);
    if (puVar7 != (undefined8 *)0x0) {
      wVar17 = borg_mon_blow_effect((char *)*puVar7);
      bVar23 = (bool)(bVar23 | wVar17 == L'\x05');
    }
  }
  wVar17 = dam;
  switch(typ) {
  case L'\x01':
    obj = (borg_item *)(pbVar11 + ammo_location);
    wVar18 = borg_best_mult((borg_item *)(pbVar11 + (ulong)uVar3 + 1),r_ptr);
    wVar17 = borg_best_mult(obj,r_ptr);
    if (wVar18 < wVar17) {
      wVar18 = borg_best_mult(obj,r_ptr);
    }
    wVar18 = wVar18 * dam;
    if ((wVar16 == L'\x01') &&
       (_Var13 = flag_has_dbg(r_ptr->flags,0xb,1,"r_ptr->flags","RF_UNIQUE"), !_Var13)) {
      wVar18 = wVar18 / 5;
    }
    wVar17 = L'\0';
    if (((wVar19 + wVar16) * 8) / 10 <= (iVar28 + sVar4 + (int)sVar5) * 3 + iVar22) {
      wVar17 = wVar18;
    }
    break;
  case L'\x02':
    if (borg_fighting_unique == L'\0') goto switchD_001fd144_caseD_3;
    bVar15 = 3 < borg.has[kv_potion_restore_mana];
    goto LAB_001fdb0f;
  default:
    goto switchD_001fd144_caseD_3;
  case L'\x04':
    pcVar27 = "RF_IM_ACID";
    iVar22 = 0x45;
    goto LAB_001fd994;
  case L'\x05':
    pcVar27 = "RF_IM_ELEC";
    iVar22 = 0x46;
    goto LAB_001fd994;
  case L'\x06':
    _Var13 = flag_has_dbg(r_ptr->flags,0xb,0x47,"r_ptr->flags","RF_IM_FIRE");
    if (_Var13) {
      dam = L'\0';
    }
    pcVar27 = "RF_HURT_FIRE";
    iVar22 = 0x43;
    goto LAB_001fd9eb;
  case L'\a':
    _Var13 = flag_has_dbg(r_ptr->flags,0xb,0x48,"r_ptr->flags","RF_IM_COLD");
    if (_Var13) {
      dam = L'\0';
    }
    pcVar27 = "RF_HURT_COLD";
    iVar22 = 0x44;
LAB_001fd9eb:
    _Var13 = flag_has_dbg(r_ptr->flags,0xb,iVar22,"r_ptr->flags",pcVar27);
    wVar17 = dam << _Var13;
    break;
  case L'\b':
    pcVar27 = "RF_IM_POIS";
    iVar22 = 0x49;
    goto LAB_001fd994;
  case L'\t':
    pcVar27 = "RF_IM_COLD";
    iVar22 = 0x48;
    goto LAB_001fd994;
  case L'\n':
    bVar15 = flag_has_dbg(r_ptr->flags,0xb,0x3d,"r_ptr->flags","RF_EVIL");
LAB_001fdb0f:
    wVar17 = dam << bVar15;
    break;
  case L'\v':
    pcVar27 = "RF_UNDEAD";
    iVar22 = 0x3e;
    goto LAB_001fddc7;
  case L'\f':
  case L'\x0f':
    pcVar27 = "RF_EVIL";
    iVar22 = 0x3d;
    goto LAB_001fddc7;
  case L'\r':
    pcVar27 = "RF_SPIRIT";
    iVar22 = 0x1b;
    goto LAB_001fddc7;
  case L'\x0e':
  case L'3':
    pbVar1 = r_ptr->flags;
    _Var13 = flag_has_dbg(pbVar1,0xb,0x52,"r_ptr->flags","RF_NO_SLEEP");
    wVar17 = L'\0';
    if (((!_Var13) &&
        ((_Var13 = flag_has_dbg(pbVar1,0xb,0x3d,"r_ptr->flags","RF_EVIL"), typ != L'\x0e' ||
         (_Var13)))) &&
       ((r_ptr->speed + L'\xfffffffb' <= (int)(uint)pbVar10[(uint)i].speed &&
        ((pbVar10[(uint)i].confused == false && (pbVar10[(uint)i].awake == true)))))) {
      iVar22 = (borg.trait[0x23] - 10U >> 2) * 3 + 10;
      if (borg.trait[0x23] < 0xd) {
        iVar22 = 10;
      }
      if (pbVar10[(uint)i].level <= iVar22) {
        _Var13 = flag_has_dbg(pbVar1,0xb,1,"r_ptr->flags","RF_UNIQUE");
        wVar17 = L'\xfffffc19';
        if (!_Var13) {
          p_Var30 = &borg_sleep_spell;
LAB_001fe05e:
          *p_Var30 = false;
          wVar16 = borg_danger_one_kill(borg.c.y,borg.c.x,L'\x01',i,true,true);
          wVar19 = wVar16;
          if ((pbVar10[(uint)i].afraid == true) &&
             (wVar19 = wVar16 + L'\x14', 10 < borg.trait[0x23])) {
            wVar19 = wVar16;
          }
          *p_Var30 = true;
          wVar16 = borg_danger_one_kill(borg.c.y,borg.c.x,L'\x01',i,true,true);
          *p_Var30 = false;
          goto LAB_001fe0cf;
        }
      }
    }
    break;
  case L'\x10':
    pcVar27 = "RF_HURT_LIGHT";
    iVar22 = 0x41;
    goto LAB_001fddc7;
  case L'\x11':
    grid1_00.y = borg.c.y;
    grid1_00.x = borg.c.x;
    wVar19 = distance(grid1_00,(loc_conflict)pbVar10[(uint)i].pos);
    wVar17 = dam / 5;
    if (wVar19 != L'\x01') {
      wVar17 = dam;
    }
    _Var13 = flag_has_dbg(r_ptr->flags,0xb,0x3e,"r_ptr->flags","RF_UNDEAD");
    if (((_Var13) ||
        (_Var13 = flag_has_dbg(r_ptr->flags,0xb,0x3b,"r_ptr->flags","RF_DEMON"), _Var13)) ||
       (pvVar21 = memchr("Egv",r_ptr->d_char,4), pvVar21 != (void *)0x0))
    goto switchD_001fd144_caseD_22;
    break;
  case L'\x12':
    pcVar27 = "RF_HURT_ROCK";
    iVar22 = 0x42;
LAB_001fddc7:
    bVar15 = flag_has_dbg(r_ptr->flags,0xb,iVar22,"r_ptr->flags",pcVar27);
LAB_001fddd1:
    wVar17 = L'\0';
    if (bVar15 != false) {
      wVar17 = dam;
    }
    break;
  case L'\x13':
    _Var13 = flag_has_dbg(r_ptr->flags,0xb,0x3e,"r_ptr->flags","RF_UNDEAD");
    if (_Var13) goto switchD_001fd144_caseD_22;
    _Var13 = flag_has_dbg(r_ptr->spell_flags,0xc,0xc,"r_ptr->spell_flags","RSF_BR_NETH");
    if (!_Var13) {
      _Var13 = flag_has_dbg(r_ptr->flags,0xb,0x3d,"r_ptr->flags","RF_EVIL");
      wVar19 = dam;
      if (_Var13) goto LAB_001fd48e;
      goto switchD_001fd144_caseD_3;
    }
    goto LAB_001fdee1;
  case L'\x14':
    _Var13 = flag_has_dbg(r_ptr->spell_flags,0xc,0x10,"r_ptr->spell_flags","RSF_BR_CHAO");
    wVar19 = dam / 3;
    if (!_Var13) {
      wVar19 = dam;
    }
    _Var13 = flag_has_dbg(r_ptr->flags,0xb,1,"r_ptr->flags","RF_UNIQUE");
    wVar17 = L'\xfffffc19';
    if (_Var13) {
      wVar17 = wVar19;
    }
    break;
  case L'\x15':
    pcVar27 = "RSF_BR_GRAV";
    iVar22 = 0x15;
    goto LAB_001fded3;
  case L'\x16':
    pcVar27 = "RSF_BR_SHAR";
    iVar22 = 0x16;
    goto LAB_001fded3;
  case L'\x17':
    pcVar27 = "RSF_BR_SOUN";
    iVar22 = 0xf;
    goto LAB_001fded3;
  case L'\x18':
    pcVar27 = "RSF_BR_PLAS";
    iVar22 = 0x17;
    goto LAB_001fded3;
  case L'\x19':
    pcVar27 = "RF_NO_CONF";
    iVar22 = 0x51;
LAB_001fd994:
    _Var13 = flag_has_dbg(r_ptr->flags,0xb,iVar22,"r_ptr->flags",pcVar27);
    if (_Var13) {
      wVar17 = L'\0';
    }
    break;
  case L'\x1a':
    pcVar27 = "RSF_BR_DISE";
    iVar22 = 0x11;
    goto LAB_001fded3;
  case L'\x1b':
    pcVar27 = "RSF_BR_NEXU";
    iVar22 = 0x12;
    goto LAB_001fded3;
  case L'\x1c':
    pcVar27 = "RSF_BR_WALL";
    iVar22 = 0x18;
    goto LAB_001fded3;
  case L'\x1d':
    pcVar27 = "RSF_BR_INER";
    iVar22 = 0x14;
    goto LAB_001fded3;
  case L'\x1e':
    pcVar27 = "RSF_BR_TIME";
    iVar22 = 0x13;
    goto LAB_001fded3;
  case L'\x1f':
    pcVar27 = "RSF_BR_LIGHT";
    iVar22 = 0xd;
    goto LAB_001fded3;
  case L' ':
    pcVar27 = "RSF_BR_DARK";
    iVar22 = 0xe;
LAB_001fded3:
    _Var13 = flag_has_dbg(r_ptr->spell_flags,0xc,iVar22,"r_ptr->spell_flags",pcVar27);
    if (_Var13) {
LAB_001fdee1:
      wVar17 = dam / 3;
    }
    else {
switchD_001fd144_caseD_3:
      wVar17 = dam;
    }
    break;
  case L'!':
    _Var13 = flag_has_dbg(r_ptr->spell_flags,0xc,0x23,"r_ptr->spell_flags","RSF_BA_WATE");
    wVar19 = dam / 3;
    if (!_Var13) {
      wVar19 = dam;
    }
    goto LAB_001fd48e;
  case L'\"':
  case L'#':
  case L'$':
  case L'%':
  case L'&':
  case L'\'':
  case L'(':
  case L')':
  case L'*':
  case L'+':
  case L',':
switchD_001fd144_caseD_22:
    wVar17 = L'\0';
    break;
  case L'-':
    _Var13 = flag_has_dbg(r_ptr->flags,0xb,1,"r_ptr->flags","RF_UNIQUE");
    if (_Var13) {
      wVar17 = L'\xffffd8f1';
      if ((0x3b < pbVar10[(uint)i].injury) || (borg_as_position != false)) break;
      if ((((dam <= (avoidance * 0xd) / 10) || (0x62 < borg.trait[0x69])) &&
          (6 < (uint)(borg_fighting_unique + L'\xfffffffe'))) &&
         ((borg.trait[0x19] != 1 ||
          (grid1_01.y = borg.c.y, grid1_01.x = borg.c.x,
          wVar19 = distance(grid1_01,(loc_conflict)pbVar10[(uint)i].pos), L'\x02' < wVar19)))) {
        wVar17 = L'\xfffffc19';
        if (vault_on_level != true) break;
        uVar25 = 0;
        for (lVar26 = 0; lVar26 != 8; lVar26 = lVar26 + 1) {
          uVar25 = uVar25 + (borg_grids[(long)ddy_ddd[lVar26] + (long)pbVar10[(uint)i].pos.y]
                             [(long)ddx_ddd[lVar26] + (long)pbVar10[(uint)i].pos.x].feat == '\x16');
        }
        if (uVar25 < 2) goto switchD_001fd144_caseD_3;
      }
    }
    lVar26 = (long)borg_tp_other_n;
    borg_tp_other_index[lVar26] = i;
    borg_tp_other_y[lVar26] = (uint8_t)pbVar10[(uint)i].pos.y;
    borg_tp_other_x[lVar26] = (uint8_t)pbVar10[(uint)i].pos.x;
    borg_tp_other_n = borg_tp_other_n + 1;
    goto switchD_001fd144_caseD_3;
  case L'.':
    wVar17 = L'\0';
    iVar24 = borg_tp_other_n;
    for (lVar26 = 0; lVar26 != 8; lVar26 = lVar26 + 1) {
      if (borg_grids[(long)ddy_ddd[lVar26] + (long)pbVar10[(uint)i].pos.y]
          [(long)ddx_ddd[lVar26] + (long)pbVar10[(uint)i].pos.x].glyph == true) {
        borg_tp_other_index[iVar24] = i;
        borg_tp_other_y[iVar24] = (uint8_t)pbVar10[(uint)i].pos.y;
        borg_tp_other_x[iVar24] = (uint8_t)pbVar10[(uint)i].pos.x;
        borg_tp_other_n = iVar24 + 1;
        wVar17 = L'Ĭ';
        iVar24 = borg_tp_other_n;
      }
    }
    if ((morgoth_on_level == true) && (borg_morgoth_position == false)) {
      borg_tp_other_index[iVar24] = i;
      borg_tp_other_y[iVar24] = (uint8_t)pbVar10[(uint)i].pos.y;
      borg_tp_other_x[iVar24] = (uint8_t)pbVar10[(uint)i].pos.x;
      borg_tp_other_n = iVar24 + 1;
      wVar17 = L'd';
      iVar24 = borg_tp_other_n;
    }
    if (piVar12[0x1e] < 0x24) {
      borg_tp_other_index[iVar24] = i;
      borg_tp_other_y[iVar24] = (uint8_t)pbVar10[(uint)i].pos.y;
      borg_tp_other_x[iVar24] = (uint8_t)pbVar10[(uint)i].pos.x;
      borg_tp_other_n = iVar24 + 1;
      wVar17 = L'\x96';
    }
    break;
  case L'/':
    _Var13 = flag_has_dbg(r_ptr->flags,0xb,1,"r_ptr->flags","RF_UNIQUE");
    if (_Var13) goto switchD_001fd144_caseD_22;
LAB_001fe0d6:
    wVar17 = borg_danger_one_kill(borg.c.y,borg.c.x,L'\x01',i,true,true);
    break;
  case L'0':
    pbVar1 = r_ptr->flags;
    _Var13 = flag_has_dbg(pbVar1,0xb,0x51,"r_ptr->flags","RF_NO_CONF");
    wVar17 = L'\0';
    if (((!_Var13) && (_Var13 = flag_has_dbg(pbVar1,0xb,0x11,"r_ptr->flags","RF_MULTIPLY"), !_Var13)
        ) && ((r_ptr->speed + L'\xfffffffb' <= (int)(uint)pbVar10[(uint)i].speed &&
              ((pbVar10[(uint)i].confused == false && (pbVar10[(uint)i].awake == true)))))) {
      iVar22 = (borg.trait[0x23] - 10U >> 2) * 3 + 10;
      if (borg.trait[0x23] < 0xd) {
        iVar22 = 10;
      }
      if (pbVar10[(uint)i].level <= iVar22) {
        _Var13 = flag_has_dbg(pbVar1,0xb,1,"r_ptr->flags","RF_UNIQUE");
        wVar17 = L'\xfffffc19';
        if (!_Var13) {
          p_Var30 = &borg_confuse_spell;
          goto LAB_001fe05e;
        }
      }
    }
    break;
  case L'1':
    wVar17 = L'\0';
    if (r_ptr->speed + L'\xfffffffb' <= (int)(uint)pbVar10[(uint)i].speed) {
      _Var13 = flag_has_dbg(r_ptr->flags,0xb,0x4f,"r_ptr->flags","RF_NO_FEAR");
      if (((!_Var13) && (pbVar10[(uint)i].confused == false)) && (pbVar10[(uint)i].awake == true)) {
        iVar22 = (borg.trait[0x23] - 10U >> 2) * 3 + 10;
        if (borg.trait[0x23] < 0xd) {
          iVar22 = 10;
        }
        if (pbVar10[(uint)i].level <= iVar22) {
          _Var13 = flag_has_dbg(r_ptr->flags,0xb,1,"r_ptr->flags","RF_UNIQUE");
          wVar17 = L'\xfffffc19';
          if (!_Var13) {
            p_Var30 = &borg_fear_mon_spell;
            goto LAB_001fe05e;
          }
        }
      }
    }
    break;
  case L'2':
    wVar17 = L'\0';
    if (((r_ptr->speed + L'\xfffffffb' <= (int)(uint)pbVar10[(uint)i].speed) &&
        (pbVar10[(uint)i].confused == false)) && (pbVar10[(uint)i].awake == true)) {
      iVar22 = (piVar12[0x23] - 10U >> 2) * 3 + 10;
      if (piVar12[0x23] < 0xd) {
        iVar22 = 10;
      }
      if (pbVar10[(uint)i].level <= iVar22) {
        _Var13 = flag_has_dbg(r_ptr->flags,0xb,1,"r_ptr->flags","RF_UNIQUE");
        wVar17 = L'\xfffffc19';
        if (!_Var13) {
          p_Var30 = &borg_slow_spell;
          goto LAB_001fe05e;
        }
      }
    }
    break;
  case L'4':
    iVar22 = (piVar12[0x23] - 10U >> 2) * 3 + 10;
    if (piVar12[0x23] < 0xd) {
      iVar22 = 10;
    }
    if (iVar22 < pbVar10[(uint)i].level) goto switchD_001fd144_caseD_22;
    _Var13 = flag_has_dbg(r_ptr->flags,0xb,1,"r_ptr->flags","RF_UNIQUE");
    wVar17 = L'\xfffffc19';
    if (((!_Var13) &&
        (wVar19 = borg_danger_one_kill(borg.c.y,borg.c.x,L'\x02',i,true,true), wVar17 = wVar19,
        wVar19 < avoidance * 2)) && (wVar17 = L'\0', pbVar10[(uint)i].afraid != false)) {
      wVar17 = wVar19;
    }
    break;
  case L'5':
    _Var13 = flag_has_dbg(r_ptr->flags,0xb,0x3e,"r_ptr->flags","RF_UNDEAD");
    wVar17 = L'\0';
    if ((((_Var13) && (pbVar10[(uint)i].confused == false)) &&
        (r_ptr->speed + L'\xfffffffb' <= (int)(uint)pbVar10[(uint)i].speed)) &&
       ((pbVar10[(uint)i].awake == true && ((int)pbVar10[(uint)i].level <= borg.trait[0x23] + -5))))
    {
      borg_fear_mon_spell = false;
      wVar19 = borg_danger_one_kill(borg.c.y,borg.c.x,L'\x01',i,true,true);
      borg_fear_mon_spell = true;
      wVar16 = borg_danger_one_kill(borg.c.y,borg.c.x,L'\x01',i,true,true);
      borg_fear_mon_spell = false;
LAB_001fe0cf:
      wVar17 = wVar19 - wVar16;
    }
    break;
  case L'6':
    _Var13 = flag_has_dbg(r_ptr->flags,0xb,0x3d,"r_ptr->flags","RF_EVIL");
    wVar17 = L'\0';
    if (_Var13) {
      _Var13 = flag_has_dbg(r_ptr->flags,0xb,1,"r_ptr->flags","RF_UNIQUE");
      if (!_Var13) goto LAB_001fe0d6;
      if ((r_ptr->friends == (monster_friends *)0x0) &&
         (wVar17 = L'\xfffffe0c', r_ptr->friends_base != (monster_friends_base *)0x0)) {
        wVar17 = L'\0';
      }
    }
    break;
  case L'7':
    _Var13 = flag_has_dbg(r_ptr->flags,0xb,0x3e,"r_ptr->flags","RF_UNDEAD");
    if (!_Var13) goto switchD_001fd144_caseD_22;
    if (0 < pbVar10[(uint)i].power) {
      wVar17 = (int)pbVar10[(uint)i].power;
    }
    break;
  case L'8':
    _Var13 = flag_has_dbg(r_ptr->flags,0xb,0x3f,"r_ptr->flags","RF_NONLIVING");
    _Var14 = flag_has_dbg(r_ptr->flags,0xb,0x3e,"r_ptr->flags","RF_UNDEAD");
    bVar15 = _Var14 && _Var13;
    goto LAB_001fddd1;
  case L'9':
    _Var13 = flag_has_dbg(r_ptr->flags,0xb,0x46,"r_ptr->flags","RF_IM_ELEC");
    if (_Var13) goto switchD_001fd144_caseD_22;
    if (borg_grids[pbVar10[(uint)i].pos.y][pbVar10[(uint)i].pos.x].feat == '\0') {
      wVar17 = L'\0';
    }
    break;
  case L':':
    wVar19 = (piVar12[0x23] / 0xc) * (pbVar10[(uint)i].injury + 0x33);
LAB_001fd48e:
    wVar17 = wVar19 / 2;
  }
  if (borg.trait[0x69] < 1) {
    bVar23 = false;
  }
  else {
    wVar19 = borg_danger_one_kill(pbVar10[(uint)i].pos.y,pbVar10[(uint)i].pos.x,L'\x01',i,true,true)
    ;
    if ((wVar19 <= avoidance / 5) &&
       ((((r_ptr->friends == (monster_friends *)0x0 &&
          (r_ptr->friends_base == (monster_friends_base *)0x0)) ||
         ((int)pbVar10[(uint)i].level < borg.trait[0x23] + -5)) &&
        (pbVar10[(uint)i].ranged_attack == '\0')))) {
      pbVar1 = r_ptr->flags;
      _Var13 = flag_has_dbg(pbVar1,0xb,1,"r_ptr->flags","RF_UNIQUE");
      if ((((!_Var13) &&
           (_Var13 = flag_has_dbg(pbVar1,0xb,0x11,"r_ptr->flags","RF_MULTIPLY"), !_Var13 && !bVar23)
           ) && (_Var13 = flag_has_dbg(pbVar1,0xb,0x15,"r_ptr->flags","RF_NEVER_MOVE"), !_Var13)) &&
         (0x14 < borg.trait[0x23])) {
        bVar23 = false;
        goto LAB_001fe2da;
      }
    }
    bVar23 = true;
  }
LAB_001fe2da:
  if ((0x36 < (uint)typ) || ((0x40600000000000U >> ((ulong)(uint)typ & 0x3f) & 1) == 0)) {
    if ((pbVar10[(uint)i].power * 2 < wVar17) &&
       (_Var13 = flag_has_dbg(r_ptr->flags,0xb,1,"r_ptr->flags","RF_UNIQUE"), !_Var13)) {
      wVar17 = pbVar10[(uint)i].power * 2;
    }
    pbVar1 = r_ptr->flags;
    _Var13 = flag_has_dbg(pbVar1,0xb,1,"r_ptr->flags","RF_UNIQUE");
    wVar19 = wVar17;
    if ((_Var13) && (wVar19 = wVar17 * 3, borg.trait[0x69] < 1)) {
      wVar19 = wVar17;
    }
    _Var13 = flag_has_dbg(pbVar1,0xb,1,"r_ptr->flags","RF_UNIQUE");
    wVar16 = wVar19;
    if ((_Var13) && (borg.trait[0x69] == 0)) {
      wVar16 = L'\0';
      if (4 < borg.trait[0x23]) {
        wVar16 = (wVar19 * 2) / 3;
      }
    }
    _Var13 = flag_has_dbg(pbVar1,0xb,0x11,"r_ptr->flags","RF_MULTIPLY");
    if (_Var13) {
      wVar16 = (wVar16 * 3) / 2;
    }
    flags = r_ptr->spell_flags;
    _Var13 = flag_has_dbg(flags,0xc,0x4c,"r_ptr->spell_flags","RSF_S_KIN");
    if ((((((_Var13) ||
           (_Var13 = flag_has_dbg(flags,0xc,0x4d,"r_ptr->spell_flags","RSF_S_HI_DEMON"), _Var13)) ||
          (_Var13 = flag_has_dbg(flags,0xc,0x4e,"r_ptr->spell_flags","RSF_S_MONSTER"), _Var13)) ||
         (((_Var13 = flag_has_dbg(flags,0xc,0x4f,"r_ptr->spell_flags","RSF_S_MONSTERS"), _Var13 ||
           (_Var13 = flag_has_dbg(flags,0xc,0x50,"r_ptr->spell_flags","RSF_S_ANIMAL"), _Var13)) ||
          ((_Var13 = flag_has_dbg(flags,0xc,0x51,"r_ptr->spell_flags","RSF_S_SPIDER"), _Var13 ||
           ((_Var13 = flag_has_dbg(flags,0xc,0x52,"r_ptr->spell_flags","RSF_S_HOUND"), _Var13 ||
            (_Var13 = flag_has_dbg(flags,0xc,0x53,"r_ptr->spell_flags","RSF_S_HYDRA"), _Var13)))))))
         ) || ((_Var13 = flag_has_dbg(flags,0xc,0x54,"r_ptr->spell_flags","RSF_S_AINU"), _Var13 ||
               (((_Var13 = flag_has_dbg(flags,0xc,0x55,"r_ptr->spell_flags","RSF_S_DEMON"), _Var13
                 || (_Var13 = flag_has_dbg(flags,0xc,0x56,"r_ptr->spell_flags","RSF_S_UNDEAD"),
                    _Var13)) ||
                (_Var13 = flag_has_dbg(flags,0xc,0x57,"r_ptr->spell_flags","RSF_S_DRAGON"), _Var13))
               )))) ||
       (((_Var13 = flag_has_dbg(flags,0xc,0x59,"r_ptr->spell_flags","RSF_S_HI_DRAGON"), _Var13 ||
         (_Var13 = flag_has_dbg(flags,0xc,0x58,"r_ptr->spell_flags","RSF_S_HI_UNDEAD"), _Var13)) ||
        ((_Var13 = flag_has_dbg(flags,0xc,0x5a,"r_ptr->spell_flags","RSF_S_WRAITH"), _Var13 ||
         (_Var13 = flag_has_dbg(flags,0xc,0x5b,"r_ptr->spell_flags","RSF_S_UNIQUE"), _Var13)))))) {
      wVar16 = (wVar16 * 3) / 2 + wVar16;
    }
    _Var13 = flag_has_dbg(pbVar1,0xb,2,"r_ptr->flags","RF_QUESTOR");
    wVar19 = wVar16 * 10;
    if (!_Var13) {
      wVar19 = wVar16;
    }
    wVar17 = L'\0';
    if (bVar23) {
      wVar17 = wVar19;
    }
    if (typ != L'\x01') {
      wVar17 = wVar19;
    }
  }
  if (L'\0' < wVar17) {
    if (((uint)typ < 0x37) && ((0x40600000000000U >> ((ulong)(uint)typ & 0x3f) & 1) != 0)) {
      return wVar17;
    }
    wVar20 = borg_danger_one_kill(wVar20,local_48,L'\x01',i,true,false);
    if (pbVar9[(uint)i].awake == false) {
      if (((avoidance / 2 < wVar20) && (wVar17 < pbVar9[(uint)i].power)) &&
         (borg.munchkin_mode != true)) {
        return L'\xfffffc19';
      }
      if (borg.trait[0x69] == 0) {
        return L'\0';
      }
    }
    wVar20 = borg_danger_one_kill(borg.c.y,borg.c.x,L'\x01',i,true,false);
    return (wVar17 << (pbVar9[(uint)i].power <= wVar17)) + wVar20;
  }
  return wVar17;
}

Assistant:

static int borg_launch_bolt_aux_hack(int i, int dam, int typ, int ammo_location)
{
    int d, p2, p1, x, y;
    int o_y     = 0;
    int o_x     = 0;
    int walls   = 0;
    int unknown = 0;

    borg_grid *ag;

    borg_kill *kill;

    struct monster_race *r_ptr;

    /* Monster */
    kill = &borg_kills[i];

    /* monster race */
    r_ptr = &r_info[kill->r_idx];

    /* Skip dead monsters */
    if (!kill->r_idx)
        return 0;

    /* "player ghosts" */
    if (kill->r_idx >= z_info->r_max - 1)
        return 0;

    /* Require current knowledge */
    if (kill->when < borg_t - 2)
        return 0;

    /* Acquire location */
    x = kill->pos.x;
    y = kill->pos.y;

    /* Acquire the grid */
    ag = &borg_grids[y][x];

    /* Never shoot walls/doors */
    if (!borg_cave_floor_grid(ag))
        return 0;

    /* dont shoot at ghosts if not on known floor grid */
    if ((rf_has(r_ptr->flags, RF_PASS_WALL))
        && (ag->feat != FEAT_FLOOR && ag->feat != FEAT_OPEN
            && ag->feat != FEAT_BROKEN && !ag->trap))
        return 0;

    /* dont shoot at ghosts in walls, not perfect */
    if (rf_has(r_ptr->flags, RF_PASS_WALL)) {
        /* if 2 walls and 1 unknown skip this monster */
        /* Acquire location */
        x = kill->pos.x;
        y = kill->pos.y;

        /* Get grid */
        for (o_x = -1; o_x <= 1; o_x++) {
            for (o_y = -1; o_y <= 1; o_y++) {
                /* Acquire location */
                x  = kill->pos.x + o_x;
                y  = kill->pos.y + o_y;

                ag = &borg_grids[y][x];

                if (ag->feat >= FEAT_MAGMA && ag->feat <= FEAT_PERM)
                    walls++;
                if (ag->feat == FEAT_NONE)
                    unknown++;
            }
        }
        /* Is the ghost likely in a wall? */
        if (walls >= 2 && unknown >= 1)
            return 0;
    }

    /* Calculate damage */
    d = borg_launch_damage_one(i, dam, typ, ammo_location);

    /* Return Damage, on Teleport Other, true damage is
     * calculated elsewhere */
    if (typ == BORG_ATTACK_AWAY_ALL || typ == BORG_ATTACK_AWAY_ALL_MORGOTH)
        return d;

    /* Return Damage as pure danger of the monster */
    if (typ == BORG_ATTACK_AWAY_EVIL)
        return d;

    /* Return 0 if the true damage (w/o the danger bonus) is 0 */
    if (d <= 0)
        return d;

    /* Calculate danger */
    p2 = borg_danger_one_kill(y, x, 1, i, true, false);

    /* Hack -- avoid waking most "hard" sleeping monsters */
    if (!kill->awake && (p2 > avoidance / 2) && (d < kill->power)
        && !borg.munchkin_mode) {
        return (-999);
    }

    /* Hack -- ignore sleeping town monsters */
    if (!borg.trait[BI_CDEPTH] && !kill->awake) {
        return 0;
    }

    /* Hack -- ignore nonthreatening town monsters when low level */
    if (!borg.trait[BI_CDEPTH] && borg.trait[BI_CLEVEL] < 3
        /* && monster_is_nonthreatening_test */) {
        /* Nothing yet */
    }

    /* Calculate "danger" to player */
    p1 = borg_danger_one_kill(borg.c.y, borg.c.x, 1, i, true, false);

    /* Extra "bonus" if attack kills */
    if (d >= kill->power)
        d = 2 * d;

    /* Add in dangers */
    d = d + p1;

    /* Result */
    return d;
}